

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::FieldDescriptorProto::Serialize(FieldDescriptorProto *this,Message *msg)

{
  uint8_t *src_begin;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 & 2) != 0) {
    protozero::Message::AppendBytes
              (msg,1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 8) != 0) {
    protozero::Message::AppendVarInt<int>(msg,3,this->number_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x10) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::FieldDescriptorProto_Label>
              (msg,4,this->label_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x20) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::FieldDescriptorProto_Type>
              (msg,5,this->type_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x40) != 0) {
    protozero::Message::AppendBytes
              (msg,6,(this->type_name_)._M_dataplus._M_p,(this->type_name_)._M_string_length);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  uVar1 = (uint)uVar2;
  if ((uVar2 & 4) != 0) {
    protozero::Message::AppendBytes
              (msg,2,(this->extendee_)._M_dataplus._M_p,(this->extendee_)._M_string_length);
    uVar1 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((char)uVar1 < '\0') {
    protozero::Message::AppendBytes
              (msg,7,(this->default_value_)._M_dataplus._M_p,(this->default_value_)._M_string_length
              );
    uVar1 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    protozero::Message::AppendVarInt<int>(msg,9,this->oneof_index_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void FieldDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 3: number
  if (_has_field_[3]) {
    msg->AppendVarInt(3, number_);
  }

  // Field 4: label
  if (_has_field_[4]) {
    msg->AppendVarInt(4, label_);
  }

  // Field 5: type
  if (_has_field_[5]) {
    msg->AppendVarInt(5, type_);
  }

  // Field 6: type_name
  if (_has_field_[6]) {
    msg->AppendString(6, type_name_);
  }

  // Field 2: extendee
  if (_has_field_[2]) {
    msg->AppendString(2, extendee_);
  }

  // Field 7: default_value
  if (_has_field_[7]) {
    msg->AppendString(7, default_value_);
  }

  // Field 9: oneof_index
  if (_has_field_[9]) {
    msg->AppendVarInt(9, oneof_index_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}